

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int walWriteOneFrame(WalWriter *p,PgHdr *pPage,int nTruncate,sqlite3_int64 iOffset)

{
  u8 *aData;
  int iVar1;
  u8 aFrame [24];
  
  aData = (u8 *)pPage->pData;
  walEncodeFrame(p->pWal,pPage->pgno,nTruncate,aData,aFrame);
  iVar1 = walWriteToLog(p,aFrame,0x18,iOffset);
  if (iVar1 == 0) {
    iVar1 = walWriteToLog(p,aData,p->szPage,iOffset + 0x18);
  }
  return iVar1;
}

Assistant:

static int walWriteOneFrame(
  WalWriter *p,               /* Where to write the frame */
  PgHdr *pPage,               /* The page of the frame to be written */
  int nTruncate,              /* The commit flag.  Usually 0.  >0 for commit */
  sqlite3_int64 iOffset       /* Byte offset at which to write */
){
  int rc;                         /* Result code from subfunctions */
  void *pData;                    /* Data actually written */
  u8 aFrame[WAL_FRAME_HDRSIZE];   /* Buffer to assemble frame-header in */
#if defined(SQLITE_HAS_CODEC)
  if( (pData = sqlite3PagerCodec(pPage))==0 ) return SQLITE_NOMEM_BKPT;
#else
  pData = pPage->pData;
#endif
  walEncodeFrame(p->pWal, pPage->pgno, nTruncate, pData, aFrame);
  rc = walWriteToLog(p, aFrame, sizeof(aFrame), iOffset);
  if( rc ) return rc;
  /* Write the page data */
  rc = walWriteToLog(p, pData, p->szPage, iOffset+sizeof(aFrame));
  return rc;
}